

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O3

void __thiscall
soul::ResolutionPass::QualifiedIdentifierResolver::visitConnectionEndpoint
          (QualifiedIdentifierResolver *this,SharedEndpoint *endpoint)

{
  size_t *psVar1;
  SharedEndpoint *pSVar2;
  Expression *pEVar3;
  long lVar4;
  ProcessorInstanceRef *pPVar5;
  pool_ptr<soul::AST::Expression> local_38;
  ProcessorBase *local_30;
  
  pSVar2 = (this->currentConnectionEndpoint).object;
  (this->currentConnectionEndpoint).object = endpoint;
  RewritingASTVisitor::replaceExpression((RewritingASTVisitor *)this,&endpoint->endpoint);
  pEVar3 = (endpoint->endpoint).object;
  if (pEVar3 != (Expression *)0x0) {
    lVar4 = __dynamic_cast(pEVar3,&AST::Expression::typeinfo,&AST::ProcessorRef::typeinfo,0);
    if (lVar4 == 0) {
      lVar4 = __dynamic_cast(pEVar3,&AST::Expression::typeinfo,&AST::ProcessorBase::typeinfo,
                             0xfffffffffffffffe);
      if (lVar4 == 0) goto LAB_0020ad0b;
    }
    psVar1 = &(this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
              super_RewritingASTVisitor.itemsReplaced;
    *psVar1 = *psVar1 + 1;
    (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[6])(&local_30,pEVar3);
    if (local_30 == (ProcessorBase *)0x0) {
      throwInternalCompilerError("object != nullptr","operator*",0x3b);
    }
    local_38.object = (Expression *)0x0;
    pPVar5 = getOrCreateImplicitProcessorInstance
                       (this,&(pEVar3->super_Statement).super_ASTObject.context,local_30,&local_38);
    (endpoint->endpoint).object = &pPVar5->super_Expression;
  }
LAB_0020ad0b:
  (this->currentConnectionEndpoint).object = pSVar2;
  return;
}

Assistant:

void visitConnectionEndpoint (AST::Connection::SharedEndpoint& endpoint)
        {
            auto oldEndpoint = currentConnectionEndpoint;
            currentConnectionEndpoint = endpoint;
            replaceExpression (endpoint.endpoint);

            if (is_type<AST::ProcessorRef> (endpoint.endpoint) || is_type<AST::ProcessorBase> (endpoint.endpoint))
            {
                ++itemsReplaced;
                endpoint.endpoint = getOrCreateImplicitProcessorInstance (endpoint.endpoint->context,
                                                                          *endpoint.endpoint->getAsProcessor(), {});
            }

            currentConnectionEndpoint = oldEndpoint;
        }